

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,half *value)

{
  bool bVar1;
  half hVar2;
  float local_24;
  half *phStack_20;
  float v;
  half *value_local;
  AsciiParser *this_local;
  
  phStack_20 = value;
  value_local = (half *)this;
  bVar1 = ReadBasicType(this,&local_24);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_24);
    phStack_20->value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::half *value) {
  // Parse as float
  float v;
  if (!ReadBasicType(&v)) {
    return false;
  }

  (*value) = value::float_to_half_full(v);
  return true;
}